

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_util.c
# Opt level: O0

void find_mismatch_plane(aom_image_t *img1,aom_image_t *img2,int plane,int use_highbitdepth,int *loc
                        )

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  bool bVar12;
  uint32_t bsize;
  int p2_stride;
  uchar *p2;
  int p1_stride;
  uchar *p1;
  uint local_c0;
  int local_b4;
  int local_b0;
  uint local_ac;
  int local_a8;
  int local_a4;
  uint local_a0;
  uint local_98;
  uint local_90;
  uint local_8c;
  int local_70;
  int local_6c;
  uint local_60;
  uint local_5c;
  int val2;
  int val1;
  int offset2;
  int offset1;
  int col;
  int row;
  int l;
  int k;
  int sj;
  int si;
  uint32_t j;
  uint32_t i;
  int match;
  uint32_t c_h;
  uint32_t c_w;
  uint32_t bsizey;
  uint32_t bsizex;
  int is_y_plane;
  
  lVar3 = *(long *)(in_RDI + 0x40 + (long)in_EDX * 8);
  iVar1 = *(int *)(in_RDI + 0x58 + (long)in_EDX * 4);
  lVar4 = *(long *)(in_RSI + 0x40 + (long)in_EDX * 8);
  iVar2 = *(int *)(in_RSI + 0x58 + (long)in_EDX * 4);
  bVar12 = in_EDX != 0;
  if (bVar12) {
    local_8c = 0x40 >> ((byte)*(undefined4 *)(in_RDI + 0x38) & 0x1f);
    local_90 = 0x40 >> ((byte)*(undefined4 *)(in_RDI + 0x3c) & 0x1f);
    uVar6 = (uint)(*(int *)(in_RDI + 0x28) + *(int *)(in_RDI + 0x38)) >>
            ((byte)*(undefined4 *)(in_RDI + 0x38) & 0x1f);
    local_98 = (uint)(*(int *)(in_RDI + 0x2c) + *(int *)(in_RDI + 0x3c)) >>
               ((byte)*(undefined4 *)(in_RDI + 0x3c) & 0x1f);
  }
  else {
    local_8c = 0x40;
    local_90 = 0x40;
    uVar6 = *(uint *)(in_RDI + 0x28);
    local_98 = *(uint *)(in_RDI + 0x2c);
  }
  in_R8[3] = -1;
  in_R8[2] = -1;
  in_R8[1] = -1;
  *in_R8 = -1;
  if (((*(int *)(in_RDI + 0x10) == 0) || (*(int *)(in_RSI + 0x10) == 0)) || (in_EDX == 0)) {
    bVar5 = true;
    for (local_5c = 0; bVar5 && local_5c < local_98; local_5c = local_90 + local_5c) {
      for (local_60 = 0; bVar5 && local_60 < uVar6; local_60 = local_8c + local_60) {
        if (bVar12) {
          if (local_5c + local_90 < local_98 - local_5c) {
            local_a8 = local_5c + local_90;
          }
          else {
            local_a8 = local_98 - local_5c;
          }
          local_a4 = local_a8;
        }
        else {
          if (local_5c + local_90 < local_98) {
            local_a0 = local_5c + local_90;
          }
          else {
            local_a0 = local_98;
          }
          local_a4 = local_a0 - local_5c;
        }
        if (bVar12) {
          if (local_60 + local_8c < uVar6 - local_60) {
            local_b4 = local_60 + local_8c;
          }
          else {
            local_b4 = uVar6 - local_60;
          }
          local_b0 = local_b4;
        }
        else {
          local_ac = uVar6;
          if (local_60 + local_8c < uVar6) {
            local_ac = local_60 + local_8c;
          }
          local_b0 = local_ac - local_60;
        }
        for (local_6c = 0; bVar5 && local_6c < local_a4; local_6c = local_6c + 1) {
          for (local_70 = 0; bVar5 && local_70 < local_b0; local_70 = local_70 + 1) {
            iVar7 = local_5c + local_6c;
            iVar8 = local_60 + local_70;
            iVar9 = iVar7 * (iVar1 >> ((byte)in_ECX & 0x1f)) + iVar8;
            iVar10 = iVar7 * (iVar2 >> ((byte)in_ECX & 0x1f)) + iVar8;
            if (in_ECX == 0) {
              uVar11 = (uint)*(byte *)(lVar3 + iVar9);
              local_c0 = (uint)*(byte *)(lVar4 + iVar10);
            }
            else {
              uVar11 = (uint)CONCAT11(*(undefined1 *)(lVar3 + (iVar9 * 2 + 1)),
                                      *(undefined1 *)(lVar3 + iVar9 * 2));
              local_c0 = (uint)CONCAT11(*(undefined1 *)(lVar4 + (iVar10 * 2 + 1)),
                                        *(undefined1 *)(lVar4 + iVar10 * 2));
            }
            if (uVar11 != local_c0) {
              *in_R8 = iVar7;
              in_R8[1] = iVar8;
              in_R8[2] = uVar11;
              in_R8[3] = local_c0;
              bVar5 = false;
              break;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void find_mismatch_plane(const aom_image_t *const img1,
                                const aom_image_t *const img2, int plane,
                                int use_highbitdepth, int loc[4]) {
  const unsigned char *const p1 = img1->planes[plane];
  const int p1_stride = img1->stride[plane] >> use_highbitdepth;
  const unsigned char *const p2 = img2->planes[plane];
  const int p2_stride = img2->stride[plane] >> use_highbitdepth;
  const uint32_t bsize = 64;
  const int is_y_plane = (plane == AOM_PLANE_Y);
  const uint32_t bsizex = is_y_plane ? bsize : bsize >> img1->x_chroma_shift;
  const uint32_t bsizey = is_y_plane ? bsize : bsize >> img1->y_chroma_shift;
  const uint32_t c_w =
      is_y_plane ? img1->d_w
                 : (img1->d_w + img1->x_chroma_shift) >> img1->x_chroma_shift;
  const uint32_t c_h =
      is_y_plane ? img1->d_h
                 : (img1->d_h + img1->y_chroma_shift) >> img1->y_chroma_shift;
  assert(img1->d_w == img2->d_w && img1->d_h == img2->d_h);
  assert(img1->x_chroma_shift == img2->x_chroma_shift &&
         img1->y_chroma_shift == img2->y_chroma_shift);
  loc[0] = loc[1] = loc[2] = loc[3] = -1;
  if (img1->monochrome && img2->monochrome && plane) return;
  int match = 1;
  uint32_t i, j;
  for (i = 0; match && i < c_h; i += bsizey) {
    for (j = 0; match && j < c_w; j += bsizex) {
      const int si =
          is_y_plane ? mmin(i + bsizey, c_h) - i : mmin(i + bsizey, c_h - i);
      const int sj =
          is_y_plane ? mmin(j + bsizex, c_w) - j : mmin(j + bsizex, c_w - j);
      int k, l;
      for (k = 0; match && k < si; ++k) {
        for (l = 0; match && l < sj; ++l) {
          const int row = i + k;
          const int col = j + l;
          const int offset1 = row * p1_stride + col;
          const int offset2 = row * p2_stride + col;
          const int val1 = use_highbitdepth
                               ? p1[2 * offset1] | (p1[2 * offset1 + 1] << 8)
                               : p1[offset1];
          const int val2 = use_highbitdepth
                               ? p2[2 * offset2] | (p2[2 * offset2 + 1] << 8)
                               : p2[offset2];
          if (val1 != val2) {
            loc[0] = row;
            loc[1] = col;
            loc[2] = val1;
            loc[3] = val2;
            match = 0;
            break;
          }
        }
      }
    }
  }
}